

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

void __thiscall QPainterPath::addPolygon(QPainterPath *this,QPolygonF *polygon)

{
  qreal *pqVar1;
  QPainterPathPrivate *pQVar2;
  long lVar3;
  QList<QPainterPath::Element> *this_00;
  ulong uVar4;
  long in_FS_OFFSET;
  Element local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((polygon->super_QList<QPointF>).d.size != 0) {
    if ((this->d_ptr).d.ptr == (QPainterPathPrivate *)0x0) {
      ensureData_helper(this);
    }
    detach(this);
    moveTo(this,(polygon->super_QList<QPointF>).d.ptr);
    if (1 < (ulong)(polygon->super_QList<QPointF>).d.size) {
      uVar4 = 1;
      lVar3 = 0x10;
      do {
        pqVar1 = (qreal *)((long)&((polygon->super_QList<QPointF>).d.ptr)->xp + lVar3);
        local_58.x = *pqVar1;
        local_58.y = pqVar1[1];
        local_58.type = LineToElement;
        local_58._20_4_ = 0xaaaaaaaa;
        pQVar2 = (this->d_ptr).d.ptr;
        this_00 = &pQVar2->elements;
        QtPrivate::QPodArrayOps<QPainterPath::Element>::emplace<QPainterPath::Element_const&>
                  ((QPodArrayOps<QPainterPath::Element> *)this_00,(pQVar2->elements).d.size,
                   &local_58);
        QList<QPainterPath::Element>::end(this_00);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < (ulong)(polygon->super_QList<QPointF>).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::addPolygon(const QPolygonF &polygon)
{
    if (polygon.isEmpty())
        return;

    ensureData();
    detach();

    moveTo(polygon.constFirst());
    for (int i=1; i<polygon.size(); ++i) {
        Element elm = { polygon.at(i).x(), polygon.at(i).y(), LineToElement };
        d_func()->elements << elm;
    }
}